

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (uint64_t tag,UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  uint64_t value;
  LogMessage *other;
  uint32_t uVar3;
  uint32_t num;
  pair<const_char_*,_unsigned_long> pVar4;
  UnknownFieldParserHelper child;
  LogFinisher local_59;
  UnknownFieldSet *local_58 [7];
  
  num = (uint32_t)(tag >> 3);
  if (num == 0) goto switchD_003ba098_default;
  switch((uint)tag & 7) {
  case 0:
    bVar1 = *ptr;
    pVar4.second = (long)(char)bVar1;
    pVar4.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar3 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar4 = VarintParseSlow64(ptr,uVar3);
        if (pVar4.first == (char *)0x0) goto switchD_003ba098_default;
      }
      else {
        pVar4.second._0_4_ = uVar3;
        pVar4.first = ptr + 2;
        pVar4.second._4_4_ = 0;
      }
    }
    ptr = pVar4.first;
    UnknownFieldSet::AddVarint(field_parser->unknown_,num,pVar4.second);
    break;
  case 1:
    value = *(uint64_t *)ptr;
    ptr = ptr + 8;
    UnknownFieldSet::AddFixed64(field_parser->unknown_,num,value);
    break;
  case 2:
    ptr = UnknownFieldParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    goto LAB_003ba156;
  case 3:
    local_58[0] = UnknownFieldSet::AddGroup(field_parser->unknown_,num);
    ptr = ParseContext::ParseGroup<google::protobuf::internal::UnknownFieldParserHelper>
                    (ctx,(UnknownFieldParserHelper *)local_58,ptr,num * 8 + 3);
LAB_003ba156:
    if (ptr == (char *)0x0) {
switchD_003ba098_default:
      ptr = (char *)0x0;
    }
    break;
  case 4:
    LogMessage::LogMessage
              ((LogMessage *)local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
               ,0x339);
    other = LogMessage::operator<<((LogMessage *)local_58,"Can\'t happen");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage((LogMessage *)local_58);
    break;
  case 5:
    uVar3 = *(uint32_t *)ptr;
    ptr = ptr + 4;
    UnknownFieldSet::AddFixed32(field_parser->unknown_,num,uVar3);
    break;
  default:
    goto switchD_003ba098_default;
  }
  return ptr;
}

Assistant:

PROTOBUF_NODISCARD const char* FieldParser(uint64_t tag, T& field_parser,
                                           const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}